

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap2.c
# Opt level: O0

void Cffgsfd(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,
            double *array,int *flagval,int *anynul,int *status)

{
  char *flagval_00;
  int local_54;
  long lStack_50;
  int i;
  long nflagval;
  char *Cflagval;
  long *trc_local;
  long *blc_local;
  long *naxes_local;
  int naxis_local;
  int colnum_local;
  fitsfile *fptr_local;
  
  lStack_50 = 1;
  for (local_54 = 0; local_54 < naxis; local_54 = local_54 + 1) {
    lStack_50 = ((trc[local_54] - blc[local_54]) / inc[local_54] + 1) * lStack_50;
  }
  flagval_00 = F2CcopyLogVect(lStack_50,flagval);
  ffgsfd(fptr,colnum,naxis,naxes,blc,trc,inc,array,flagval_00,anynul,status);
  C2FcopyLogVect(lStack_50,flagval,flagval_00);
  return;
}

Assistant:

void Cffgsfd( fitsfile *fptr, int colnum, int naxis, long *naxes, long *blc, long *trc, long *inc, double *array, int *flagval, int *anynul, int *status )
{
   char *Cflagval;
   long nflagval;
   int i;
 
   for( nflagval=1, i=0; i<naxis; i++ )
      nflagval *= (trc[i]-blc[i])/inc[i]+1;
   Cflagval = F2CcopyLogVect(nflagval, flagval );
   ffgsfd( fptr, colnum, naxis, naxes, blc, trc, inc, array, Cflagval, anynul, status );   
   C2FcopyLogVect(nflagval, flagval, Cflagval);
}